

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

StringDataBlobImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::StringDataBlobImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::StringDataBlobImpl,Diligent::IMemoryAllocator> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *CtorArgs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  StringDataBlobImpl *local_30;
  StringDataBlobImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *CtorArgs_local;
  MakeNewRCObj<Diligent::StringDataBlobImpl,_Diligent::IMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pbVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (StringDataBlobImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (StringDataBlobImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_30 = (StringDataBlobImpl *)
               RefCountedObject<Diligent::IDataBlob>::operator_new
                         ((RefCountedObject<Diligent::IDataBlob> *)0x30,(size_t)pbVar1);
    StringDataBlobImpl::StringDataBlobImpl<std::__cxx11::string>
              (local_30,(IReferenceCounters *)pObj,CtorArgs);
  }
  else {
    local_30 = (StringDataBlobImpl *)
               new<Diligent::IMemoryAllocator>
                         (0x30,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    StringDataBlobImpl::StringDataBlobImpl<std::__cxx11::string>
              (local_30,(IReferenceCounters *)pObj,CtorArgs);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::StringDataBlobImpl,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_30,*(IMemoryAllocator **)this);
  }
  return local_30;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }